

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_gettable_sskey(lua_State *L,TValue *t,TValue *key,StkId val)

{
  byte bVar1;
  ushort uVar2;
  lua_CFunction p_Var3;
  TString *key_00;
  TString *pTVar4;
  GCObject *pGVar5;
  uint __line;
  TValue *n;
  char *pcVar6;
  
  if (t->tt_ != 0x8005) {
    if ((t->tt_ & 0xf) == 5) {
      luaG_typeerror(L,t,"incorrectly index");
    }
    n = (TValue *)0x0;
    goto LAB_0012ca4b;
  }
  p_Var3 = (t->value_).f;
  if (p_Var3[8] != (_func_int_lua_State_ptr)0x5) {
    pcVar6 = "(((t)->value_).gc)->tt == 5";
    goto LAB_0012ca96;
  }
  if ((key->tt_ & 0xf) != 4) {
    pcVar6 = "(((((((key))->tt_)) & 0x0F)) == (4))";
    goto LAB_0012ca96;
  }
  key_00 = (TString *)(key->value_).gc;
  if ((key_00->tt & 0xf) != 4) {
    pcVar6 = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
    goto LAB_0012ca96;
  }
  if (key_00->tt != 4) {
    pcVar6 = "key->tt == ((4) | ((0) << 4))";
    __line = 0x5a;
    goto LAB_0012cace;
  }
  n = (TValue *)((ulong)(*(uint *)(p_Var3 + 0x38) & key_00->hash) * 0x20 + *(long *)(p_Var3 + 0x18))
  ;
  if ((((Node *)n)->i_key).nk.tt_ != 0x8004) {
LAB_0012c9bd:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(key_00,(Node *)n);
    }
LAB_0012c9d4:
    if ((((Node *)n)->i_val).tt_ != 0) {
      pGVar5 = (((Node *)n)->i_val).value_.gc;
      (val->value_).gc = pGVar5;
      uVar2 = (((Node *)n)->i_val).tt_;
      val->tt_ = uVar2;
      if ((-1 < (short)uVar2) ||
         (((uVar2 & 0x7f) == (ushort)pGVar5->tt &&
          ((L == (lua_State *)0x0 || ((pGVar5->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))))) {
        return;
      }
      pcVar6 = "0";
LAB_0012ca96:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc5c,"void raviV_gettable_sskey(lua_State *, const TValue *, TValue *, StkId)"
                   );
    }
LAB_0012ca4b:
    luaV_finishget(L,t,key,val,n);
    return;
  }
  pTVar4 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
  bVar1 = pTVar4->tt;
  if ((bVar1 & 0xf) == 4) {
    if (bVar1 == 4) {
      if (pTVar4 != key_00) goto LAB_0012c9bd;
      goto LAB_0012c9d4;
    }
    pcVar6 = 
    "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
    ;
  }
  else {
    pcVar6 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
  }
  __line = 0x5c;
LAB_0012cace:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                ,__line,"const TValue *luaH_getshortstr(Table *, TString *)");
}

Assistant:

void raviV_gettable_sskey(lua_State *L, const TValue *t, TValue *key, StkId val) {
  GETTABLE_INLINE_SSKEY(L, t, key, val);
}